

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O3

void __thiscall
sqvector<SQVM::CallInfo>::resize
          (sqvector<SQVM::CallInfo> *this,SQUnsignedInteger newsize,CallInfo *fill)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQObjectPtr *pSVar4;
  SQGenerator *pSVar5;
  SQInt32 SVar6;
  SQInt32 SVar7;
  undefined4 uVar8;
  SQInt32 SVar9;
  SQInt32 SVar10;
  CallInfo *pCVar11;
  ulong uVar12;
  SQUnsignedInteger SVar13;
  long lVar14;
  
  if (this->_allocated < newsize) {
    pCVar11 = (CallInfo *)sq_vm_realloc(this->_vals,this->_allocated * 0x48,newsize * 0x48);
    this->_vals = pCVar11;
    this->_allocated = newsize;
  }
  uVar12 = this->_size;
  if (uVar12 < newsize) {
    do {
      pCVar11 = this->_vals;
      pSVar4 = fill->_literals;
      pCVar11[uVar12]._ip = fill->_ip;
      pCVar11[uVar12]._literals = pSVar4;
      SVar2 = (fill->_closure).super_SQObject._type;
      pCVar11[uVar12]._closure.super_SQObject._type = SVar2;
      pSVar3 = (fill->_closure).super_SQObject._unVal.pTable;
      pCVar11[uVar12]._closure.super_SQObject._unVal.pTable = pSVar3;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      pCVar11[uVar12]._root = fill->_root;
      pSVar5 = fill->_generator;
      SVar9 = fill->_etraps;
      SVar10 = fill->_prevstkbase;
      SVar6 = fill->_target;
      SVar7 = fill->_ncalls;
      uVar8 = *(undefined4 *)&fill->field_0x3c;
      pCVar11[uVar12]._prevtop = fill->_prevtop;
      pCVar11[uVar12]._target = SVar6;
      pCVar11[uVar12]._ncalls = SVar7;
      *(undefined4 *)&pCVar11[uVar12].field_0x3c = uVar8;
      pCVar11[uVar12]._generator = pSVar5;
      pCVar11[uVar12]._etraps = SVar9;
      pCVar11[uVar12]._prevstkbase = SVar10;
      uVar12 = this->_size + 1;
      this->_size = uVar12;
    } while (uVar12 < newsize);
  }
  else {
    if (newsize < uVar12) {
      lVar14 = newsize * 0x48 + 0x10;
      SVar13 = newsize;
      do {
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)((long)&this->_vals->_ip + lVar14));
        SVar13 = SVar13 + 1;
        lVar14 = lVar14 + 0x48;
      } while (SVar13 < this->_size);
    }
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(SQUnsignedInteger newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(SQUnsignedInteger i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }